

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

int decode_nvrm_ioctl(uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
                     uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc,char *name
                     )

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  nvrm_ioctl *in_stack_ffffffffffffffb8;
  nvrm_ioctl *ioctl;
  _func_void_void_ptr_mmt_memory_dump_ptr_int *fun_with_args;
  _func_void_void_ptr *fun;
  int args_used;
  int found;
  int k;
  mmt_buf *buf_local;
  uint16_t size_local;
  uint8_t nr_local;
  uint8_t dir_local;
  uint32_t id_local;
  uint32_t fd_local;
  
  bVar1 = false;
  bVar3 = false;
  args_used = 0;
  do {
    if (nvrm_ioctls_cnt <= args_used) {
LAB_0026f725:
      if (bVar1) {
        if ((((!bVar3) && (dump_decoded_ioctl_data != 0)) &&
            (in_stack_ffffffffffffffb8->disabled == 0)) || (dump_raw_ioctl_data != 0)) {
          dump_args(args,argc,0);
        }
        id_local = 0;
      }
      else {
        id_local = 1;
      }
      return id_local;
    }
    lVar2 = (long)args_used;
    in_stack_ffffffffffffffb8 = nvrm_ioctls + lVar2;
    if (in_stack_ffffffffffffffb8->id == id) {
      if (nvrm_ioctls[lVar2].size == buf->len) {
        if ((dump_decoded_ioctl_data != 0) && (nvrm_ioctls[lVar2].disabled == 0)) {
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG: %-26s %-5s fd: %d, ",nvrm_ioctls[lVar2].name,name,(ulong)fd,buf,
                    in_stack_ffffffffffffffb8,0,0);
          }
          else {
            fprintf(_stdout,"%64s%-26s %-5s fd: %d, "," ",nvrm_ioctls[lVar2].name,name,(ulong)fd,
                    in_stack_ffffffffffffffb8,0,0);
          }
          if (ret != 0) {
            fprintf(_stdout,"ret: %ld, ",ret);
          }
          if (err != 0) {
            fprintf(_stdout,"%serr: %ld%s, ",colors->err,err,colors->reset);
          }
          nvrm_reset_pfx();
          if ((code *)in_stack_ffffffffffffffb8->fun != (code *)0x0) {
            (*(code *)in_stack_ffffffffffffffb8->fun)(buf + 1);
          }
          bVar3 = (code *)in_stack_ffffffffffffffb8->fun_with_args != (code *)0x0;
          if (bVar3) {
            (*(code *)in_stack_ffffffffffffffb8->fun_with_args)(buf + 1,args,argc);
          }
        }
        bVar1 = true;
      }
      goto LAB_0026f725;
    }
    args_used = args_used + 1;
  } while( true );
}

Assistant:

static int decode_nvrm_ioctl(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr,
		uint16_t size, struct mmt_buf *buf, uint64_t ret, uint64_t err,
		void *state, struct mmt_memory_dump *args, int argc, const char *name)
{
	int k, found = 0;
	int args_used = 0;
	void (*fun)(void *) = NULL;
	void (*fun_with_args)(void *, struct mmt_memory_dump *, int argc) = NULL;

	struct nvrm_ioctl *ioctl;
	for (k = 0; k < nvrm_ioctls_cnt; ++k)
	{
		ioctl = &nvrm_ioctls[k];
		if (ioctl->id == id)
		{
			if (ioctl->size == buf->len)
			{
				if (dump_decoded_ioctl_data && !ioctl->disabled)
				{
					mmt_log("%-26s %-5s fd: %d, ", ioctl->name, name, fd);
					if (ret)
						mmt_log_cont("ret: %" PRId64 ", ", ret);
					if (err)
						mmt_log_cont("%serr: %" PRId64 "%s, ", colors->err, err, colors->reset);

					nvrm_reset_pfx();
					fun = ioctl->fun;
					if (fun)
						fun(buf->data);
					fun_with_args = ioctl->fun_with_args;
					if (fun_with_args)
					{
						fun_with_args(buf->data, args, argc);
						args_used = 1;
					}
				}
				found = 1;
			}
			break;
		}
	}

	if (!found)
		return 1;

	if ((!args_used && dump_decoded_ioctl_data && !ioctl->disabled) || dump_raw_ioctl_data)
		dump_args(args, argc, 0);

	return 0;
}